

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::DefaultMinimize::handleUnsat(DefaultMinimize *this,Solver *s,bool up,LitVec *out)

{
  uint uVar1;
  uint uVar2;
  SharedData *pSVar3;
  uint uVar4;
  bool bVar5;
  
  pSVar3 = (this->super_MinimizeConstraint).shared_;
  if (pSVar3->optGen_ == 0) {
    bVar5 = pSVar3->mode_ == enumerate;
LAB_00151ab0:
    if (!bVar5) {
      bVar5 = commitLowerBound(this,s,up);
      goto LAB_00151acb;
    }
  }
  else if (pSVar3->mode_ != enumerate) {
    bVar5 = (pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar3->optGen_;
    goto LAB_00151ab0;
  }
  bVar5 = false;
LAB_00151acb:
  uVar1 = (this->super_MinimizeConstraint).tag_.rep_;
  uVar2 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
  uVar4 = uVar2 >> 4;
  if ((byte)((byte)uVar2 & 3) != (byte)(2U - ((uVar1 & 2) == 0))) {
    uVar4 = 0;
  }
  relaxBound(this,false);
  if (((bVar5 != false) && (uVar4 != 0)) && (uVar1 = (s->levels_).root, uVar4 <= uVar1)) {
    Solver::popRootLevel(s,uVar1 - uVar4,out,true);
    bVar5 = Solver::popRootLevel(s,1,(LitVec *)0x0,true);
    return bVar5;
  }
  return false;
}

Assistant:

bool DefaultMinimize::handleUnsat(Solver& s, bool up, LitVec& out) {
	bool more = shared_->optimize() && commitLowerBound(s, up);
	uint32 dl = s.isTrue(tag_) ? s.level(tag_.var()) : 0;
	relaxBound(false);
	if (more && dl && dl <= s.rootLevel()) {
		s.popRootLevel(s.rootLevel()-dl, &out); // pop and remember new path
		return s.popRootLevel(1);               // pop tag - disable constraint
	}
	return false;
}